

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

int __thiscall FBlockLinesIterator::init(FBlockLinesIterator *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int extraout_EAX;
  int y;
  int x;
  
  dVar1 = bmaporgy;
  validcount = validcount + 1;
  this->maxy = (int)((*(double *)ctx - bmaporgy) * 0.0078125);
  y = (int)((*(double *)(ctx + 8) - dVar1) * 0.0078125);
  this->miny = y;
  dVar1 = bmaporgx;
  this->maxx = (int)((*(double *)(ctx + 0x18) - bmaporgx) * 0.0078125);
  x = (int)((*(double *)(ctx + 0x10) - dVar1) * 0.0078125);
  this->minx = x;
  StartBlock(this,x,y);
  return extraout_EAX;
}

Assistant:

void FBlockLinesIterator::init(const FBoundingBox &box)
{
	validcount++;
	maxy = GetBlockY(box.Top());
	miny = GetBlockY(box.Bottom());
	maxx = GetBlockX(box.Right());
	minx = GetBlockX(box.Left());
	Reset();
}